

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O2

void __thiscall
tonk::SessionOutgoing::sendQueuedDatagram
          (SessionOutgoing *this,OutgoingQueuedDatagram *datagram,uint sequenceNumberBytes,
          uint sequenceNumber)

{
  uint8_t *data;
  SimpleCipher *this_00;
  uint uVar1;
  undefined4 uVar2;
  IUDPSender *pIVar3;
  SenderBandwidthControl *pSVar4;
  uint uVar5;
  uint16_t uVar6;
  uint16_t uVar7;
  uint32_t uVar8;
  NonceT sequence;
  uint64_t uVar9;
  uint uVar10;
  int iVar11;
  uint8_t *puVar12;
  byte bVar13;
  ulong uVar14;
  uint nonceBytes;
  uint local_54;
  uint8_t *local_50;
  int iStack_48;
  OutgoingQueuedDatagram *pOStack_40;
  OutgoingQueueCommon *pOStack_38;
  
  uVar10 = datagram->NextWriteOffset;
  uVar14 = (ulong)uVar10;
  data = datagram->Data;
  if (((this->Deps).EnablePadding == true) &&
     (uVar10 + 2 <= (this->super_OutgoingQueueCommon).MaxMessageSectionBytes)) {
    uVar8 = siamese::PCGRandom::Next(&this->PaddingPRNG);
    uVar1 = (this->super_OutgoingQueueCommon).MaxMessageSectionBytes;
    uVar5 = uVar1 - uVar10;
    if (uVar10 + (byte)TONK_RAND_PAD_EXP[uVar8 & 0xff] <= uVar1) {
      uVar5 = (uint)(byte)TONK_RAND_PAD_EXP[uVar8 & 0xff];
    }
    if (1 < uVar5) {
      *(ushort *)(datagram->Data + uVar14 + 2 + -2) = (ushort)(uVar5 - 2) | 0x2000;
      memset(datagram->Data + uVar14 + 2,0,(ulong)(uVar5 - 2));
      uVar14 = (ulong)(uVar5 + uVar10);
    }
  }
  puVar12 = data + uVar14;
  bVar13 = this->ShouldCompressSequenceNumbers << 5 | 0x80;
  if (sequenceNumberBytes != 0) {
    bVar13 = bVar13 | (byte)sequenceNumberBytes;
    *(uint *)puVar12 = sequenceNumber;
    puVar12 = puVar12 + sequenceNumberBytes;
  }
  sequence = writeNonce(this,puVar12,&local_54);
  puVar12 = puVar12 + local_54;
  bVar13 = (char)local_54 * '\x04' | bVar13;
  if (((this->ShouldAttachHandshake)._M_base._M_i & 1U) != 0) {
    uVar2 = *(undefined4 *)(this->Handshake + 8);
    bVar13 = bVar13 | 0x40;
    *(undefined8 *)puVar12 = *(undefined8 *)this->Handshake;
    *(undefined4 *)(puVar12 + 8) = uVar2;
    puVar12 = puVar12 + 0xc;
  }
  this_00 = &this->Encryptor;
  puVar12[3] = bVar13;
  uVar10 = (int)puVar12 - (int)data;
  security::SimpleCipher::Cipher(this_00,data,(uint)uVar14,sequence);
  uVar6 = security::SimpleCipher::Tag(this_00,data,uVar10,sequence);
  iVar11 = uVar10 + 6;
  uVar9 = siamese::GetTimeUsec();
  uVar7 = security::SimpleCipher::TagInt(this_00,(uint)bVar13 | (int)(uVar9 >> 3) << 8);
  puVar12[2] = (char)(uVar9 >> 0x13);
  *(short *)puVar12 = (short)(uVar9 >> 3);
  *(uint16_t *)(puVar12 + 4) = uVar7 ^ uVar6;
  uVar10 = datagram->CompressionSavings;
  pIVar3 = (this->Deps).UDPSender;
  local_50 = data;
  iStack_48 = iVar11;
  pOStack_40 = datagram;
  pOStack_38 = &this->super_OutgoingQueueCommon;
  (*pIVar3->_vptr_IUDPSender[2])(pIVar3,&this->PeerUDPAddress,(this->Deps).ConnectionRef);
  pSVar4 = (this->Deps).SenderControl;
  LOCK();
  (pSVar4->AvailableTokens).super___atomic_base<int>._M_i =
       (pSVar4->AvailableTokens).super___atomic_base<int>._M_i - iVar11;
  UNLOCK();
  if (sequenceNumberBytes != 0) {
    pSVar4->RecoverySendTokens = pSVar4->RecoverySendTokens + 0x400;
  }
  pSVar4->ProbeSendTokens = pSVar4->ProbeSendTokens + uVar10 + iVar11;
  return;
}

Assistant:

void SessionOutgoing::sendQueuedDatagram(
    OutgoingQueuedDatagram* datagram,
    unsigned sequenceNumberBytes,
    unsigned sequenceNumber)
{
    // If this function changes, also update PostRecovery() and PostDummyDatagram() to keep it in sync.

    uint8_t* datagramData = datagram->Data;
    unsigned messageBytes = datagram->NextWriteOffset;

    TONK_DEBUG_ASSERT(messageBytes > 0);

#ifdef TONK_ENABLE_RANDOM_PADDING
    unsigned paddingBytes = 0;

    // If there is room for one more message in the datagram:
    if (Deps.EnablePadding &&
        messageBytes + protocol::kMessageFrameBytes <= MaxMessageSectionBytes)
    {
        // Select the number of bytes to pad
        unsigned targetPadBytes = TONK_RAND_PAD_EXP[PaddingPRNG.Next() % 256];

        TONK_DEBUG_ASSERT(targetPadBytes <= protocol::kMaxRandomPaddingBytes);
        if (messageBytes + targetPadBytes > MaxMessageSectionBytes) {
            targetPadBytes = MaxMessageSectionBytes - messageBytes;
        }

        // If there is at least a frame worth of padding:
        if (targetPadBytes >= protocol::kMessageFrameBytes)
        {
            // Write frame header
            protocol::WriteMessageFrameHeader(
                datagramData + messageBytes,
                protocol::MessageType_Padding,
                targetPadBytes - protocol::kMessageFrameBytes);

            // Zero the padding bytes to avoid sending confidential data
            memset(
                datagramData + messageBytes + protocol::kMessageFrameBytes,
                0,
                targetPadBytes - protocol::kMessageFrameBytes);

            paddingBytes += targetPadBytes;
            messageBytes += targetPadBytes;
        }
    }
#endif // TONK_ENABLE_RANDOM_PADDING

    uint8_t* footer = datagramData + messageBytes;
    uint8_t flags = protocol::kConnectionMask;
    if (ShouldCompressSequenceNumbers) {
        flags |= protocol::kSeqCompMask;
    }

    if (sequenceNumberBytes > 0)
    {
        flags |= sequenceNumberBytes;
        protocol::WriteFooterField(footer, sequenceNumber, sequenceNumberBytes);
        footer += sequenceNumberBytes;
    }

    // Write packet nonce to header
    unsigned nonceBytes;
    const NonceT nonce = writeNonce(footer, nonceBytes);
    flags |= nonceBytes << 2;
    footer += nonceBytes;

    if (ShouldAttachHandshake)
    {
        flags |= protocol::kHandshakeMask;
        const uint32_t b = siamese::ReadU32_LE(Handshake + 8);
        const uint64_t a = siamese::ReadU64_LE(Handshake);
        siamese::WriteU64_LE(footer, a);
        siamese::WriteU32_LE(footer + 8, b);
        footer += protocol::kHandshakeBytes;
    }

    // Tag checksum includes all the data before the timestamp
    const unsigned taggedBytes = (unsigned)(footer - datagramData);

    // Skip over the timestamp
    uint8_t* timestampData = footer;
    footer += protocol::kTimestampBytes;

    // Write flags
    footer[0] = flags;
    ++footer;

    // Encrypt message data but not the footer
    Encryptor.Cipher(datagramData, messageBytes, nonce);

    // Generate the main packet data tag
    uint16_t tag = Encryptor.Tag(datagramData, taggedBytes, nonce);
    static_assert(protocol::kEncryptionTagBytes == 2, "Update this if that changes");
    uint8_t* tagData = footer;

    const unsigned sendBytes = taggedBytes + protocol::kUntaggedDatagramBytes;

    DatagramBuffer datagramBuffer;
    datagramBuffer.AllocatorForFree = &WriteAllocator;
    datagramBuffer.Data = datagramData;
    datagramBuffer.FreePtr = datagram;
    datagramBuffer.Bytes = sendBytes;

    TONK_DEBUG_ASSERT(Deps.UDPSender != nullptr);
    TONK_DEBUG_ASSERT(HasPeerAddress);

    TONK_VERBOSE_OUTGOING_LOG("sendQueuedDatagram: datagram = ", datagram, " sequenceNumber=",
        sequenceNumber, " sequenceNumberBytes=", sequenceNumberBytes, " bytes=", datagramBuffer.Bytes);

#ifdef TONK_DETAILED_STATS
    DetailStats* stats = Deps.Deets->GetWritePtr();
    for (int i = 0; i < Stats_QueueCount; ++i) {
        stats->Stats[i] += datagram->Stats[i];
    }
    stats->Stats[Stats_PaddingBytesSent] += paddingBytes;
    stats->Stats[Stats_FootersBytesSent] += sendBytes - messageBytes;
#endif // TONK_DETAILED_STATS

    // Write timestamp and final tag - Reduce noise in timestamp measurements
    const uint64_t nowUsec = siamese::GetTimeUsec();
    const uint32_t timestamp24 = (uint32_t)(nowUsec >> kTime23LostBits);
    tag ^= Encryptor.TagInt(protocol::TimestampFlagTagInt(timestamp24, flags));
    siamese::WriteU24_LE(timestampData, timestamp24);
    siamese::WriteU16_LE(tagData, tag);

    const unsigned compressionSavings = datagram->CompressionSavings;

    // Send the data
    Deps.UDPSender->Send(
        PeerUDPAddress,
        datagramBuffer,
        Deps.ConnectionRef);

    // Update bandwidth control
    Deps.SenderControl->OnSendDatagram(
        compressionSavings,
        sendBytes,
        sequenceNumberBytes > 0);
}